

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Glucose::IntOption::help(IntOption *this,bool verbose)

{
  byte in_SIL;
  long in_RDI;
  
  fprintf(_stderr,"  -%-12s = %-8s [",*(undefined8 *)(in_RDI + 8),*(undefined8 *)(in_RDI + 0x20));
  if (*(int *)(in_RDI + 0x28) == -0x80000000) {
    fprintf(_stderr,"imin");
  }
  else {
    fprintf(_stderr,"%4d",(ulong)*(uint *)(in_RDI + 0x28));
  }
  fprintf(_stderr," .. ");
  if (*(int *)(in_RDI + 0x2c) == 0x7fffffff) {
    fprintf(_stderr,"imax");
  }
  else {
    fprintf(_stderr,"%4d",(ulong)*(uint *)(in_RDI + 0x2c));
  }
  fprintf(_stderr,"] (default: %d)\n",(ulong)*(uint *)(in_RDI + 0x30));
  if ((in_SIL & 1) != 0) {
    fprintf(_stderr,"\n        %s\n",*(undefined8 *)(in_RDI + 0x10));
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

virtual void help (bool verbose = false){
        fprintf(stderr, "  -%-12s = %-8s [", name, type_name);
        if (range.begin == INT32_MIN)
            fprintf(stderr, "imin");
        else
            fprintf(stderr, "%4d", range.begin);

        fprintf(stderr, " .. ");
        if (range.end == INT32_MAX)
            fprintf(stderr, "imax");
        else
            fprintf(stderr, "%4d", range.end);

        fprintf(stderr, "] (default: %d)\n", value);
        if (verbose){
            fprintf(stderr, "\n        %s\n", description);
            fprintf(stderr, "\n");
        }
    }